

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_modules.cpp
# Opt level: O1

void module_with_async_launch(uint W)

{
  char *pcVar1;
  Node *pNVar2;
  Node *pNVar3;
  Node *pNVar4;
  Node *pNVar5;
  code *pcVar6;
  double dVar7;
  FlowBuilder FVar8;
  FlowBuilder FVar9;
  char extraout_AL;
  bool bVar10;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar12;
  in_place_type_t<tf::Node::Module> local_3e9;
  Task D;
  Task C;
  Task E;
  Task B;
  int local_3c8;
  int cnt;
  ResultBuilder DOCTEST_RB;
  Task A;
  Result local_340;
  Taskflow f1;
  shared_ptr<tf::WorkerInterface> local_258;
  anon_class_8_1_6ca262cf local_248;
  undefined4 local_240;
  Task m1_1;
  Taskflow f0;
  Executor executor;
  
  local_258.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_258.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(ulong)W,&local_258);
  if (local_258.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_258.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  f0.super_FlowBuilder._graph = &f0._graph;
  f0._mutex.super___mutex_base._M_mutex.__align = 0;
  f0._mutex.super___mutex_base._M_mutex._8_8_ = 0;
  f0._mutex.super___mutex_base._M_mutex._16_8_ = 0;
  f0._mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  f0._mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  f0._name._M_dataplus._M_p = (pointer)&f0._name.field_2;
  f0._name._M_string_length = 0;
  f0._name.field_2._M_local_buf[0] = '\0';
  f0._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f0._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f0._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f0._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  f0._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  f0._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  f0._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  f0._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  f0._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  f0._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  f0._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  f0._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  f0._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
  _M_initialize_map((_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
                     *)&f0._topologies,0);
  FVar8._graph = f0.super_FlowBuilder._graph;
  f0._satellite.super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>._M_payload.
  super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>._M_engaged = false;
  cnt = 0;
  f1.super_FlowBuilder._graph = (Graph *)operator_new(0xd8);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 1);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[1].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
  f1.super_FlowBuilder._graph[1].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&f1.super_FlowBuilder._graph[5].
                 super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&cnt;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:443:23)>
                ::_M_invoke;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:443:23)>
                ::_M_manager;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[8].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 1;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar8._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&f1);
  if (f1.super_FlowBuilder._graph != (Graph *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)&f1,(Node *)f1.super_FlowBuilder._graph);
  }
  FVar9._graph = f0.super_FlowBuilder._graph;
  A._node = ((FVar8._graph)->
            super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ).
            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
            super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
            super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
            super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  f1.super_FlowBuilder._graph = (Graph *)operator_new(0xd8);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 1);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[1].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
  f1.super_FlowBuilder._graph[1].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&f1.super_FlowBuilder._graph[5].
                 super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&cnt;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:444:23)>
                ::_M_invoke;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:444:23)>
                ::_M_manager;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[8].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 1;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar9._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&f1);
  if (f1.super_FlowBuilder._graph != (Graph *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)&f1,(Node *)f1.super_FlowBuilder._graph);
  }
  FVar8._graph = f0.super_FlowBuilder._graph;
  B._node = ((FVar9._graph)->
            super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ).
            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
            super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
            super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
            super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  f1.super_FlowBuilder._graph = (Graph *)operator_new(0xd8);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 1);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[1].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
  f1.super_FlowBuilder._graph[1].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&f1.super_FlowBuilder._graph[5].
                 super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&cnt;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:445:23)>
                ::_M_invoke;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:445:23)>
                ::_M_manager;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[8].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 1;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar8._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&f1);
  if (f1.super_FlowBuilder._graph != (Graph *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)&f1,(Node *)f1.super_FlowBuilder._graph);
  }
  FVar9._graph = f0.super_FlowBuilder._graph;
  C._node = ((FVar8._graph)->
            super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ).
            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
            super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
            super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
            super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  f1.super_FlowBuilder._graph = (Graph *)operator_new(0xd8);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 1);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[1].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
  f1.super_FlowBuilder._graph[1].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&f1.super_FlowBuilder._graph[5].
                 super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&cnt;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:446:23)>
                ::_M_invoke;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:446:23)>
                ::_M_manager;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[8].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 1;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar9._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&f1);
  if (f1.super_FlowBuilder._graph != (Graph *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)&f1,(Node *)f1.super_FlowBuilder._graph);
  }
  FVar8._graph = f0.super_FlowBuilder._graph;
  D._node = ((FVar9._graph)->
            super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ).
            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
            super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
            super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
            super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  f1.super_FlowBuilder._graph = (Graph *)operator_new(0xd8);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 1);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[1].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
  f1.super_FlowBuilder._graph[1].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&f1.super_FlowBuilder._graph[5].
                 super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&cnt;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:447:23)>
                ::_M_invoke;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:447:23)>
                ::_M_manager;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[8].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 1;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar8._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&f1);
  if (f1.super_FlowBuilder._graph != (Graph *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)&f1,(Node *)f1.super_FlowBuilder._graph);
  }
  E._node = ((FVar8._graph)->
            super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ).
            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
            super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
            super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
            super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  tf::Task::precede<tf::Task&>(&A,&B);
  tf::Task::precede<tf::Task&>(&B,&C);
  tf::Task::precede<tf::Task&>(&C,&D);
  tf::Task::precede<tf::Task&>(&D,&E);
  f1.super_FlowBuilder._graph = &f1._graph;
  f1._mutex.super___mutex_base._M_mutex.__align = 0;
  f1._mutex.super___mutex_base._M_mutex._8_8_ = 0;
  f1._mutex.super___mutex_base._M_mutex._16_8_ = 0;
  f1._mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  f1._mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  f1._name._M_dataplus._M_p = (pointer)&f1._name.field_2;
  f1._name._M_string_length = 0;
  f1._name.field_2._M_local_buf[0] = '\0';
  f1._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  f1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  f1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  f1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  f1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  f1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  f1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  f1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  f1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  f1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
  _M_initialize_map((_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
                     *)&f1._topologies,0);
  FVar8._graph = f1.super_FlowBuilder._graph;
  f1._satellite.super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>._M_payload.
  super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>._M_engaged = false;
  DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)operator_new(0xd8);
  ((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0.data.ptr = (char *)0x0;
  *(uint **)((long)&((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0 + 8) =
       &(DOCTEST_RB.super_AssertData.m_test_case)->m_line;
  *(undefined8 *)((long)&((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0 + 0x10) = 0;
  *(undefined1 *)&(DOCTEST_RB.super_AssertData.m_test_case)->m_line = 0;
  pcVar1 = (char *)((long)&DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0 + 0x10);
  (DOCTEST_RB.super_AssertData.m_test_case)->m_test_suite = (char *)0x0;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_description = (char *)0x0;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_skip = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_no_breaks = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_no_output = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_may_fail = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_should_fail = false;
  *(undefined3 *)&(DOCTEST_RB.super_AssertData.m_test_case)->field_0x3d = 0;
  *(undefined8 *)&(DOCTEST_RB.super_AssertData.m_test_case)->m_expected_failures = 0;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_timeout = (double)pcVar1;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0.data.ptr = pcVar1;
  *(char ***)((long)&DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0 + 8) =
       &DOCTEST_RB.super_AssertData.m_test_case[1].m_description;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_description = (char *)0x0;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_skip = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_no_breaks = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_no_output = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_may_fail = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_should_fail = false;
  *(undefined3 *)&DOCTEST_RB.super_AssertData.m_test_case[1].field_0x3d = 0;
  *(undefined8 *)&DOCTEST_RB.super_AssertData.m_test_case[1].m_expected_failures = 0;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_timeout = 0.0;
  *(Taskflow **)&DOCTEST_RB.super_AssertData.m_test_case[1].m_skip = (Taskflow *)&cnt;
  DOCTEST_RB.super_AssertData.m_test_case[2].m_file.field_0.data.ptr =
       (char *)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:458:5)>
               ::_M_invoke;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_timeout =
       (double)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:458:5)>
               ::_M_manager;
  *(undefined1 *)&DOCTEST_RB.super_AssertData.m_test_case[2].m_name = 1;
  DOCTEST_RB.super_AssertData.m_test_case[2].m_test_suite = (char *)0x0;
  DOCTEST_RB.super_AssertData.m_test_case[2].m_description = (char *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar8._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&DOCTEST_RB);
  if (DOCTEST_RB.super_AssertData.m_test_case != (TestCaseData *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)&DOCTEST_RB,
               (Node *)DOCTEST_RB.super_AssertData.m_test_case);
  }
  FVar9._graph = f1.super_FlowBuilder._graph;
  pNVar2 = ((FVar8._graph)->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)operator_new(0xd8);
  ((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0.data.ptr = (char *)0x0;
  *(uint **)((long)&((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0 + 8) =
       &(DOCTEST_RB.super_AssertData.m_test_case)->m_line;
  *(undefined8 *)((long)&((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0 + 0x10) = 0;
  *(undefined1 *)&(DOCTEST_RB.super_AssertData.m_test_case)->m_line = 0;
  pcVar1 = (char *)((long)&DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0 + 0x10);
  (DOCTEST_RB.super_AssertData.m_test_case)->m_test_suite = (char *)0x0;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_description = (char *)0x0;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_skip = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_no_breaks = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_no_output = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_may_fail = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_should_fail = false;
  *(undefined3 *)&(DOCTEST_RB.super_AssertData.m_test_case)->field_0x3d = 0;
  *(undefined8 *)&(DOCTEST_RB.super_AssertData.m_test_case)->m_expected_failures = 0;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_timeout = (double)pcVar1;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0.data.ptr = pcVar1;
  *(char ***)((long)&DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0 + 8) =
       &DOCTEST_RB.super_AssertData.m_test_case[1].m_description;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_description = (char *)0x0;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_skip = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_no_breaks = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_no_output = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_may_fail = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_should_fail = false;
  *(undefined3 *)&DOCTEST_RB.super_AssertData.m_test_case[1].field_0x3d = 0;
  *(undefined8 *)&DOCTEST_RB.super_AssertData.m_test_case[1].m_expected_failures = 0;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_timeout = 0.0;
  *(Taskflow **)&DOCTEST_RB.super_AssertData.m_test_case[1].m_skip = (Taskflow *)&cnt;
  DOCTEST_RB.super_AssertData.m_test_case[2].m_file.field_0.data.ptr =
       (char *)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:459:5)>
               ::_M_invoke;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_timeout =
       (double)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:459:5)>
               ::_M_manager;
  *(undefined1 *)&DOCTEST_RB.super_AssertData.m_test_case[2].m_name = 1;
  DOCTEST_RB.super_AssertData.m_test_case[2].m_test_suite = (char *)0x0;
  DOCTEST_RB.super_AssertData.m_test_case[2].m_description = (char *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar9._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&DOCTEST_RB);
  if (DOCTEST_RB.super_AssertData.m_test_case != (TestCaseData *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)&DOCTEST_RB,
               (Node *)DOCTEST_RB.super_AssertData.m_test_case);
  }
  FVar8._graph = f1.super_FlowBuilder._graph;
  pNVar3 = ((FVar9._graph)->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)operator_new(0xd8);
  ((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0.data.ptr = (char *)0x0;
  *(uint **)((long)&((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0 + 8) =
       &(DOCTEST_RB.super_AssertData.m_test_case)->m_line;
  *(undefined8 *)((long)&((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0 + 0x10) = 0;
  *(undefined1 *)&(DOCTEST_RB.super_AssertData.m_test_case)->m_line = 0;
  pcVar1 = (char *)((long)&DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0 + 0x10);
  (DOCTEST_RB.super_AssertData.m_test_case)->m_test_suite = (char *)0x0;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_description = (char *)0x0;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_skip = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_no_breaks = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_no_output = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_may_fail = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_should_fail = false;
  *(undefined3 *)&(DOCTEST_RB.super_AssertData.m_test_case)->field_0x3d = 0;
  *(undefined8 *)&(DOCTEST_RB.super_AssertData.m_test_case)->m_expected_failures = 0;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_timeout = (double)pcVar1;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0.data.ptr = pcVar1;
  *(char ***)((long)&DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0 + 8) =
       &DOCTEST_RB.super_AssertData.m_test_case[1].m_description;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_description = (char *)0x0;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_skip = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_no_breaks = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_no_output = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_may_fail = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_should_fail = false;
  *(undefined3 *)&DOCTEST_RB.super_AssertData.m_test_case[1].field_0x3d = 0;
  *(undefined8 *)&DOCTEST_RB.super_AssertData.m_test_case[1].m_expected_failures = 0;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_timeout = 0.0;
  *(Taskflow **)&DOCTEST_RB.super_AssertData.m_test_case[1].m_skip = (Taskflow *)&cnt;
  DOCTEST_RB.super_AssertData.m_test_case[2].m_file.field_0.data.ptr =
       (char *)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:460:5)>
               ::_M_invoke;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_timeout =
       (double)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:460:5)>
               ::_M_manager;
  *(undefined1 *)&DOCTEST_RB.super_AssertData.m_test_case[2].m_name = 1;
  DOCTEST_RB.super_AssertData.m_test_case[2].m_test_suite = (char *)0x0;
  DOCTEST_RB.super_AssertData.m_test_case[2].m_description = (char *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar8._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&DOCTEST_RB);
  if (DOCTEST_RB.super_AssertData.m_test_case != (TestCaseData *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)&DOCTEST_RB,
               (Node *)DOCTEST_RB.super_AssertData.m_test_case);
  }
  FVar9._graph = f1.super_FlowBuilder._graph;
  pNVar4 = ((FVar8._graph)->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)operator_new(0xd8);
  ((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0.data.ptr = (char *)0x0;
  *(uint **)((long)&((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0 + 8) =
       &(DOCTEST_RB.super_AssertData.m_test_case)->m_line;
  *(undefined8 *)((long)&((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0 + 0x10) = 0;
  *(undefined1 *)&(DOCTEST_RB.super_AssertData.m_test_case)->m_line = 0;
  pcVar1 = (char *)((long)&DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0 + 0x10);
  (DOCTEST_RB.super_AssertData.m_test_case)->m_test_suite = (char *)0x0;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_description = (char *)0x0;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_skip = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_no_breaks = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_no_output = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_may_fail = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_should_fail = false;
  *(undefined3 *)&(DOCTEST_RB.super_AssertData.m_test_case)->field_0x3d = 0;
  *(undefined8 *)&(DOCTEST_RB.super_AssertData.m_test_case)->m_expected_failures = 0;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_timeout = (double)pcVar1;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0.data.ptr = pcVar1;
  *(char ***)((long)&DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0 + 8) =
       &DOCTEST_RB.super_AssertData.m_test_case[1].m_description;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_description = (char *)0x0;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_skip = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_no_breaks = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_no_output = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_may_fail = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_should_fail = false;
  *(undefined3 *)&DOCTEST_RB.super_AssertData.m_test_case[1].field_0x3d = 0;
  *(undefined8 *)&DOCTEST_RB.super_AssertData.m_test_case[1].m_expected_failures = 0;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_timeout = 0.0;
  *(Taskflow **)&DOCTEST_RB.super_AssertData.m_test_case[1].m_skip = (Taskflow *)&cnt;
  DOCTEST_RB.super_AssertData.m_test_case[2].m_file.field_0.data.ptr =
       (char *)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:461:5)>
               ::_M_invoke;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_timeout =
       (double)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:461:5)>
               ::_M_manager;
  *(undefined1 *)&DOCTEST_RB.super_AssertData.m_test_case[2].m_name = 1;
  DOCTEST_RB.super_AssertData.m_test_case[2].m_test_suite = (char *)0x0;
  DOCTEST_RB.super_AssertData.m_test_case[2].m_description = (char *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar9._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&DOCTEST_RB);
  if (DOCTEST_RB.super_AssertData.m_test_case != (TestCaseData *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)&DOCTEST_RB,
               (Node *)DOCTEST_RB.super_AssertData.m_test_case);
  }
  FVar8._graph = f1.super_FlowBuilder._graph;
  pNVar5 = ((FVar9._graph)->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)operator_new(0xd8);
  ((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0.data.ptr = (char *)0x0;
  *(uint **)((long)&((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0 + 8) =
       &(DOCTEST_RB.super_AssertData.m_test_case)->m_line;
  *(undefined8 *)((long)&((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0 + 0x10) = 0;
  *(undefined1 *)&(DOCTEST_RB.super_AssertData.m_test_case)->m_line = 0;
  pcVar1 = (char *)((long)&DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0 + 0x10);
  (DOCTEST_RB.super_AssertData.m_test_case)->m_test_suite = (char *)0x0;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_description = (char *)0x0;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_skip = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_no_breaks = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_no_output = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_may_fail = false;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_should_fail = false;
  *(undefined3 *)&(DOCTEST_RB.super_AssertData.m_test_case)->field_0x3d = 0;
  *(undefined8 *)&(DOCTEST_RB.super_AssertData.m_test_case)->m_expected_failures = 0;
  (DOCTEST_RB.super_AssertData.m_test_case)->m_timeout = (double)pcVar1;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0.data.ptr = pcVar1;
  *(char ***)((long)&DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0 + 8) =
       &DOCTEST_RB.super_AssertData.m_test_case[1].m_description;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_description = (char *)0x0;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_skip = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_no_breaks = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_no_output = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_may_fail = false;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_should_fail = false;
  *(undefined3 *)&DOCTEST_RB.super_AssertData.m_test_case[1].field_0x3d = 0;
  *(undefined8 *)&DOCTEST_RB.super_AssertData.m_test_case[1].m_expected_failures = 0;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_timeout = 0.0;
  *(Taskflow **)&DOCTEST_RB.super_AssertData.m_test_case[1].m_skip = (Taskflow *)&cnt;
  DOCTEST_RB.super_AssertData.m_test_case[2].m_file.field_0.data.ptr =
       (char *)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:462:5)>
               ::_M_invoke;
  DOCTEST_RB.super_AssertData.m_test_case[1].m_timeout =
       (double)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:462:5)>
               ::_M_manager;
  *(undefined1 *)&DOCTEST_RB.super_AssertData.m_test_case[2].m_name = 1;
  DOCTEST_RB.super_AssertData.m_test_case[2].m_test_suite = (char *)0x0;
  DOCTEST_RB.super_AssertData.m_test_case[2].m_description = (char *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar8._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&DOCTEST_RB);
  if (DOCTEST_RB.super_AssertData.m_test_case != (TestCaseData *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)&DOCTEST_RB,
               (Node *)DOCTEST_RB.super_AssertData.m_test_case);
  }
  E._node = ((FVar8._graph)->
            super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ).
            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
            super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
            super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
            super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  D._node = pNVar5;
  C._node = pNVar4;
  B._node = pNVar3;
  A._node = pNVar2;
  tf::Task::precede<tf::Task&>(&A,&B);
  tf::Task::precede<tf::Task&>(&B,&C);
  tf::Task::precede<tf::Task&>(&C,&D);
  tf::Task::precede<tf::Task&>(&D,&E);
  DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)0x0;
  local_340._0_8_ = (void *)0x0;
  local_248.target = (Taskflow *)((ulong)local_248.target._4_4_ << 0x20);
  m1_1._node = tf::Graph::
               _emplace_back<int_const&,int_const&,tf::DefaultTaskParams,decltype(nullptr),decltype(nullptr),int,std::in_place_type_t<tf::Node::Module>,tf::Taskflow&>
                         (f1.super_FlowBuilder._graph,&tf::NSTATE::NONE,&tf::ESTATE::NONE,
                          (DefaultTaskParams *)&local_3c8,(void **)&DOCTEST_RB,(void **)&local_340,
                          (int *)&local_248,&local_3e9,&f0);
  tf::Task::precede<tf::Task&>(&E,&m1_1);
  local_340._0_8_ = &f1;
  tf::Executor::
  async<tf::DefaultTaskParams,tf::Algorithm::make_module_task<tf::Taskflow&>(tf::Taskflow&)::_lambda(tf::Runtime&)_1_>
            ((Executor *)&DOCTEST_RB,(DefaultTaskParams *)&executor,&local_248);
  std::future<void>::get((future<void> *)&DOCTEST_RB);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(DOCTEST_RB.super_AssertData._12_4_,DOCTEST_RB.super_AssertData.m_at) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(DOCTEST_RB.super_AssertData._12_4_,DOCTEST_RB.super_AssertData.m_at));
  }
  DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
  DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
  DOCTEST_RB.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp"
  ;
  DOCTEST_RB.super_AssertData.m_line = 0x1d9;
  DOCTEST_RB.super_AssertData.m_expr = "cnt == 10";
  DOCTEST_RB.super_AssertData.m_failed = true;
  DOCTEST_RB.super_AssertData.m_threw = false;
  DOCTEST_RB.super_AssertData.m_threw_as = false;
  DOCTEST_RB.super_AssertData.m_exception_type = "";
  DOCTEST_RB.super_AssertData.m_exception_string = "";
  local_240 = 0xc;
  local_3c8 = 10;
  local_248.target = (Taskflow *)&cnt;
  doctest::detail::Expression_lhs<int_const&>::operator==
            (&local_340,(Expression_lhs<int_const&> *)&local_248,&local_3c8);
  doctest::String::operator=
            (&DOCTEST_RB.super_AssertData.m_decomp,(String *)&local_340.m_decomp.field_0.data);
  DOCTEST_RB.super_AssertData._40_2_ =
       CONCAT11(DOCTEST_RB.super_AssertData.m_threw,local_340.m_passed) ^ 1;
  uVar11 = extraout_XMM0_Da;
  uVar12 = extraout_XMM0_Db;
  if ((local_340.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_340.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_340.m_decomp.field_0.data.ptr);
    uVar11 = extraout_XMM0_Da_00;
    uVar12 = extraout_XMM0_Db_00;
  }
  dVar7 = doctest::detail::ResultBuilder::log(&DOCTEST_RB,(double)CONCAT44(uVar12,uVar11));
  if (extraout_AL != '\0') {
    pcVar6 = (code *)swi(3);
    (*pcVar6)(SUB84(dVar7,0));
    return;
  }
  if (DOCTEST_RB.super_AssertData.m_failed == true) {
    bVar10 = doctest::detail::checkIfShouldThrow(DOCTEST_RB.super_AssertData.m_at);
    if (bVar10) {
      doctest::detail::throwException();
    }
  }
  if ((DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                       DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                                       DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                       DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                                       DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]));
  }
  tf::Taskflow::~Taskflow(&f1);
  tf::Taskflow::~Taskflow(&f0);
  tf::Executor::~Executor(&executor);
  return;
}

Assistant:

void module_with_async_launch(unsigned W) {

  tf::Executor executor(W);

  tf::Taskflow f0;

  int cnt {0};

  auto A = f0.emplace([&cnt](){ ++cnt; });
  auto B = f0.emplace([&cnt](){ ++cnt; });
  auto C = f0.emplace([&cnt](){ ++cnt; });
  auto D = f0.emplace([&cnt](){ ++cnt; });
  auto E = f0.emplace([&cnt](){ ++cnt; });

  A.precede(B);
  B.precede(C);
  C.precede(D);
  D.precede(E);

  tf::Taskflow f1;

  // module 1
  std::tie(A, B, C, D, E) = f1.emplace(
    [&cnt] () { ++cnt; },
    [&cnt] () { ++cnt; },
    [&cnt] () { ++cnt; },
    [&cnt] () { ++cnt; },
    [&cnt] () { ++cnt; }
  );
  A.precede(B);
  B.precede(C);
  C.precede(D);
  D.precede(E);
  auto m1_1 = f1.composed_of(f0);
  E.precede(m1_1);

  executor.async(tf::make_module_task(f1)).get(); 

  REQUIRE(cnt == 10);
}